

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elasticConstantsCmd.cpp
# Opt level: O1

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  int check_ambiguity;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  size_t sVar7;
  char **ppcVar8;
  uint *prev_given;
  uint *field_given;
  int iVar9;
  custom_getopt_data *pcVar10;
  int iVar11;
  option *poVar12;
  char *pcVar13;
  char **possible_values;
  long lVar14;
  size_t sVar15;
  custom_getopt_data *pcVar16;
  uint uVar17;
  option *poVar18;
  option *poVar19;
  ulong uVar20;
  char cVar21;
  int iVar22;
  char *pcVar23;
  bool bVar24;
  char *pcVar25;
  cmdline_parser_arg_type arg_type;
  undefined8 in_stack_fffffffffffffe30;
  char **ppcVar26;
  gengetopt_args_info local_e8;
  
  package_name = *argv;
  iVar22 = params->override;
  check_ambiguity = params->check_ambiguity;
  if (params->initialize != 0) {
    in_stack_fffffffffffffe30 = 0x1306f1;
    cmdline_parser_init(args_info);
  }
  local_e8.method_given = 0;
  local_e8.npoints_given = 0;
  local_e8.delta_given = 0;
  local_e8.help_given = 0;
  local_e8.version_given = 0;
  local_e8.input_given = 0;
  local_e8.box_given = 0;
  local_e8.box_flag = 0;
  local_e8.input_arg = (char *)0x0;
  local_e8.input_orig = (char *)0x0;
  local_e8.method_arg = (char *)0x0;
  local_e8.method_orig = (char *)0x0;
  local_e8.npoints_arg = 0x19;
  local_e8.npoints_orig = (char *)0x0;
  local_e8.delta_orig = (char *)0x0;
  local_e8.help_help = gengetopt_args_info_help[0];
  local_e8.version_help = gengetopt_args_info_help[1];
  local_e8.input_help = gengetopt_args_info_help[2];
  local_e8.box_help = gengetopt_args_info_help[3];
  local_e8.method_help = gengetopt_args_info_help[4];
  local_e8.npoints_help = gengetopt_args_info_help[5];
  local_e8.delta_help = gengetopt_args_info_help[6];
  local_e8.inputs = (char **)0x0;
  local_e8.inputs_num = 0;
  pcVar10 = (custom_getopt_data *)(ulong)(uint)params->print_errors;
  pcVar16 = (custom_getopt_data *)0x0;
  iVar11 = 0;
  pcVar13 = (char *)pcVar10;
  ppcVar26 = argv;
  do {
    iVar9 = (int)pcVar10;
    custom_opterr = iVar9;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar11;
    if (argc < 1) {
      iVar5 = -1;
    }
    else {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (custom_getopt_data *)0x0;
      if ((iVar11 == 0) || ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 & 1) == 0)) {
        if (iVar11 == 0) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 1;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 = 1;
      }
      custom_optarg = (char *)pcVar16;
      if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == (custom_getopt_data *)0x0) ||
         (*(char *)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind == '\0')) {
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        pcVar13 = (char *)CONCAT71((int7)((ulong)pcVar13 >> 8),
                                   _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
                                   _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
                                   _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
                                   _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7);
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
          if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 !=
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
        }
        else {
          in_stack_fffffffffffffe30 = 0x130949;
          exchange(argv,(custom_getopt_data *)pcVar13);
        }
        iVar11 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 < argc) {
          ppcVar8 = argv + _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          do {
            if ((**ppcVar8 == '-') &&
               (iVar11 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0, (*ppcVar8)[1] != '\0'
               )) break;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
            ppcVar8 = ppcVar8 + 1;
            iVar11 = argc;
          } while (argc != _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0);
        }
        iVar5 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        iVar2 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
        iVar3 = iVar11;
        if (iVar11 != argc) {
          pcVar13 = "--";
          in_stack_fffffffffffffe30 = 0x13099b;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = iVar11;
          iVar4 = strcmp(argv[iVar11],"--");
          iVar5 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          iVar2 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          iVar3 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
          if ((iVar4 == 0) &&
             (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar11 + 1, iVar5 = argc,
             iVar2 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0, iVar3 = argc,
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 != iVar11)) {
            in_stack_fffffffffffffe30 = 0x1309c0;
            exchange(argv,(custom_getopt_data *)pcVar13);
            iVar5 = argc;
            iVar2 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
            iVar3 = argc;
          }
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = iVar3;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = iVar2;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar5;
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == argc) {
          iVar5 = -1;
          if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 !=
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          }
LAB_00130a3b:
          bVar24 = false;
        }
        else {
          pcVar16 = (custom_getopt_data *)argv[_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0]
          ;
          if ((*(char *)&pcVar16->custom_optind != '-') ||
             (cVar21 = *(char *)((long)&pcVar16->custom_optind + 1), cVar21 == '\0')) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
            iVar5 = 1;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar16;
            goto LAB_00130a3b;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
               (custom_getopt_data *)((long)&pcVar16->custom_optind + (ulong)(cVar21 == '-') + 1);
          iVar5 = 0;
          bVar24 = true;
        }
        if (!bVar24) goto LAB_00130dbb;
      }
      pcVar16 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
      iVar11 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      lVar14 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      pcVar25 = argv[lVar14];
      argv = ppcVar26;
      if (pcVar25[1] == '-') {
        for (sVar15 = 0;
            (cVar21 = *(char *)((long)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->
                                       custom_optind + sVar15), cVar21 != '\0' && (cVar21 != '='));
            sVar15 = sVar15 + 1) {
        }
        bVar1 = false;
        bVar24 = true;
        pcVar23 = "help";
        poVar12 = cmdline_parser_internal::long_options;
        poVar18 = (option *)0x0;
        do {
          in_stack_fffffffffffffe30 = 0x130b3a;
          pcVar13 = (char *)pcVar16;
          iVar5 = strncmp(pcVar23,(char *)pcVar16,sVar15);
          poVar19 = poVar18;
          if (iVar5 == 0) {
            in_stack_fffffffffffffe30 = 0x130b46;
            sVar7 = strlen(pcVar23);
            poVar19 = poVar12;
            if ((int)sVar7 == (int)sVar15) break;
            if ((poVar18 != (option *)0x0) &&
               (((poVar18->has_arg != poVar12->has_arg || (poVar18->flag != poVar12->flag)) ||
                (poVar19 = poVar18, poVar18->val != poVar12->val)))) {
              bVar1 = true;
              poVar19 = poVar18;
            }
          }
          pcVar23 = poVar12[1].name;
          poVar12 = poVar12 + 1;
          bVar24 = pcVar23 != (char *)0x0;
          poVar18 = poVar19;
        } while (bVar24);
        if ((bool)(!bVar1 | bVar24)) {
          ppcVar26 = argv;
          if (poVar19 == (option *)0x0) {
            if (iVar9 != 0) {
              pcVar13 = "%s: unrecognized option `--%s\'\n";
              in_stack_fffffffffffffe30 = 0x130fb5;
              fprintf(_stderr,"%s: unrecognized option `--%s\'\n",*argv,pcVar16);
            }
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x29ca5d;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
LAB_00130db0:
            iVar5 = 0x3f;
          }
          else {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar11 + 1;
            if (*(char *)((long)&pcVar16->custom_optind + sVar15) == '\0') {
              if (poVar19->has_arg == 1) {
                if (argc <= _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
                  if (iVar9 != 0) {
                    pcVar23 = *argv;
                    pcVar13 = "%s: option `%s\' requires an argument\n";
                    goto LAB_00130fec;
                  }
                  goto LAB_00130d93;
                }
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar11 + 2;
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                     (custom_getopt_data *)argv[lVar14 + 1];
              }
            }
            else {
              if (poVar19->has_arg == 0) {
                if (iVar9 != 0) {
                  pcVar23 = *argv;
                  if (pcVar25[1] == '-') {
                    pcVar25 = poVar19->name;
                    pcVar13 = "%s: option `--%s\' doesn\'t allow an argument\n";
LAB_00130fec:
                    fprintf(_stderr,pcVar13,pcVar23,pcVar25);
                  }
                  else {
                    pcVar13 = "%s: option `%c%s\' doesn\'t allow an argument\n";
                    fprintf(_stderr,"%s: option `%c%s\' doesn\'t allow an argument\n",pcVar23,
                            (ulong)(uint)(int)*pcVar25,poVar19->name);
                  }
                }
LAB_00130d93:
                pcVar16 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
                in_stack_fffffffffffffe30 = 0x130da2;
                sVar15 = strlen((char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5);
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
                     (custom_getopt_data *)((long)&pcVar16->custom_optind + sVar15);
                ppcVar26 = argv;
                goto LAB_00130db0;
              }
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                   (custom_getopt_data *)((long)&pcVar16->custom_optind + sVar15 + 1);
            }
            in_stack_fffffffffffffe30 = 0x130cc5;
            sVar15 = strlen((char *)pcVar16);
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
                 (custom_getopt_data *)((long)&pcVar16->custom_optind + sVar15);
            iVar5 = poVar19->val;
            if (poVar19->flag != (int *)0x0) {
              *poVar19->flag = iVar5;
              iVar5 = 0;
            }
          }
        }
        else {
          if (iVar9 != 0) {
            pcVar13 = "%s: option `%s\' is ambiguous\n";
            fprintf(_stderr,"%s: option `%s\' is ambiguous\n",*argv,pcVar25);
          }
          pcVar16 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
          in_stack_fffffffffffffe30 = 0x130c2b;
          sVar15 = strlen((char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5);
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
               (custom_getopt_data *)((long)&pcVar16->custom_optind + sVar15);
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
          iVar5 = 0x3f;
          ppcVar26 = argv;
        }
      }
      else {
        pcVar10 = (custom_getopt_data *)
                  ((long)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind + 1);
        cVar21 = *(char *)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind;
        uVar17 = (uint)cVar21;
        pcVar13 = (char *)(ulong)uVar17;
        in_stack_fffffffffffffe30 = 0x130ab0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar10;
        pvVar6 = memchr("hVi:bm:n:d:",uVar17,0xc);
        if (*(char *)((long)&pcVar16->custom_optind + 1) == '\0') {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar11 + 1;
        }
        if (cVar21 == ':' || pvVar6 == (void *)0x0) {
          iVar5 = 0x3f;
          ppcVar26 = argv;
          if (iVar9 != 0) {
            pcVar13 = "%s: invalid option -- %c\n";
            in_stack_fffffffffffffe30 = 0x130b0b;
            fprintf(_stderr,"%s: invalid option -- %c\n",*argv,(ulong)uVar17);
          }
        }
        else {
          if (*(char *)((long)pvVar6 + 1) == ':') {
            if (*(char *)((long)pvVar6 + 2) == ':') {
              if (*(char *)&pcVar10->custom_optind == '\0') {
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (custom_getopt_data *)0x0;
              }
              else {
LAB_00130c71:
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                     _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar10;
              }
            }
            else {
              if (*(char *)&pcVar10->custom_optind != '\0') goto LAB_00130c71;
              lVar14 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
              if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == argc) {
                cVar21 = '?';
                if (iVar9 != 0) {
                  pcVar13 = "%s: option requires an argument -- %c\n";
                  in_stack_fffffffffffffe30 = 0x130d5d;
                  fprintf(_stderr,"%s: option requires an argument -- %c\n",*argv,(ulong)uVar17);
                }
              }
              else {
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                     _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                     (custom_getopt_data *)argv[lVar14];
              }
            }
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x0;
          }
          iVar5 = (int)cVar21;
          ppcVar26 = argv;
        }
      }
    }
LAB_00130dbb:
    pcVar16 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    iVar11 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    custom_optarg = (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    pcVar10 = (custom_getopt_data *)(ulong)(uint)custom_opterr;
    if (iVar5 < 0x56) {
      if (iVar5 == -1) {
        iVar9 = 3;
      }
      else {
        if ((iVar5 != 0) && (iVar5 != 0x3f)) goto switchD_00130df7_caseD_63;
        iVar9 = 5;
      }
      goto LAB_00130f70;
    }
    switch(iVar5) {
    case 0x62:
      pcVar13 = (char *)0x0;
      possible_values = (char **)0x0;
      pcVar23 = (char *)0x62;
      iVar9 = 0x29bf7b;
      iVar5 = 1;
      arg_type = ARG_FLAG;
      prev_given = &local_e8.box_given;
      field_given = &args_info->box_given;
      ppcVar8 = (char **)&args_info->box_flag;
      break;
    case 100:
      possible_values = (char **)0x0;
      pcVar23 = (char *)0x64;
      iVar9 = 0x29a1ba;
      iVar5 = 0;
      arg_type = ARG_DOUBLE;
      prev_given = &local_e8.delta_given;
      field_given = &args_info->delta_given;
      pcVar13 = (char *)&args_info->delta_orig;
      ppcVar8 = (char **)&args_info->delta_arg;
      break;
    case 0x68:
      goto switchD_00130df7_caseD_68;
    case 0x69:
      possible_values = (char **)0x0;
      pcVar23 = (char *)0x69;
      iVar9 = 0x29a1a5;
      prev_given = &local_e8.input_given;
      field_given = &args_info->input_given;
      pcVar13 = (char *)&args_info->input_orig;
      ppcVar8 = &args_info->input_arg;
      goto LAB_00130f4d;
    case 0x6d:
      possible_values = cmdline_parser_method_values;
      pcVar23 = (char *)0x6d;
      iVar9 = 0x29a1ab;
      prev_given = &local_e8.method_given;
      field_given = &args_info->method_given;
      pcVar13 = (char *)&args_info->method_orig;
      ppcVar8 = &args_info->method_arg;
LAB_00130f4d:
      iVar5 = 0;
      arg_type = ARG_STRING;
      break;
    case 0x6e:
      possible_values = (char **)0x0;
      pcVar23 = (char *)0x6e;
      iVar9 = 0x29a1b2;
      iVar5 = 0;
      arg_type = ARG_INT;
      pcVar25 = "25";
      prev_given = &local_e8.npoints_given;
      field_given = &args_info->npoints_given;
      pcVar13 = (char *)&args_info->npoints_orig;
      ppcVar8 = (char **)&args_info->npoints_arg;
      goto LAB_00130f5c;
    default:
      if (iVar5 == 0x56) {
        cmdline_parser_print_version();
        goto LAB_001310a9;
      }
    case 99:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6c:
switchD_00130df7_caseD_63:
      cmdline_parser_internal();
      goto switchD_00130df7_caseD_68;
    }
    pcVar25 = (char *)0x0;
LAB_00130f5c:
    iVar5 = update_arg(ppcVar8,(char **)pcVar13,field_given,prev_given,
                       (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3,possible_values,
                       pcVar25,arg_type,check_ambiguity,iVar22,iVar5,iVar9,pcVar23,
                       (char)in_stack_fffffffffffffe30,(char *)ppcVar26);
    iVar9 = 5;
    if (iVar5 == 0) {
      iVar9 = 0;
    }
LAB_00130f70:
    if (iVar9 != 0) {
      if (iVar9 == 5) {
        cmdline_parser_release(&local_e8);
        iVar22 = 1;
      }
      else {
        cmdline_parser_release(&local_e8);
        iVar22 = 0;
        uVar17 = argc - iVar11;
        if (uVar17 != 0 && iVar11 <= argc) {
          args_info->inputs_num = uVar17;
          ppcVar8 = (char **)malloc((ulong)uVar17 * 8);
          args_info->inputs = ppcVar8;
          iVar22 = 0;
          uVar20 = 0;
          do {
            pcVar13 = gengetopt_strdup(ppcVar26[(long)iVar11 + uVar20]);
            args_info->inputs[uVar20] = pcVar13;
            uVar20 = uVar20 + 1;
          } while (uVar17 != uVar20);
        }
      }
      return iVar22;
    }
  } while( true );
switchD_00130df7_caseD_68:
  cmdline_parser_print_help();
LAB_001310a9:
  cmdline_parser_free(&local_e8);
  exit(0);
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  override = params->override;
  initialize = params->initialize;
  check_required = params->check_required;
  FIX_UNUSED(check_required);
  check_ambiguity = params->check_ambiguity;

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "input",	1, NULL, 'i' },
        { "box",	0, NULL, 'b' },
        { "method",	1, NULL, 'm' },
        { "npoints",	1, NULL, 'n' },
        { "delta",	1, NULL, 'd' },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVi:bm:n:d:", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'i':	/* Input file name.  */
        
        
          if (update_arg( (void *)&(args_info->input_arg), 
               &(args_info->input_orig), &(args_info->input_given),
              &(local_args_info.input_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "input", 'i',
              additional_error))
            goto failure;
        
          break;
        case 'b':	/* Optimize box geometry before performing calculation.  */
        
        
          if (update_arg((void *)&(args_info->box_flag), 0, &(args_info->box_given),
              &(local_args_info.box_given), optarg, 0, 0, ARG_FLAG,
              check_ambiguity, override, 1, 0, "box", 'b',
              additional_error))
            goto failure;
        
          break;
        case 'm':	/* Calculation Method.  */
        
        
          if (update_arg( (void *)&(args_info->method_arg), 
               &(args_info->method_orig), &(args_info->method_given),
              &(local_args_info.method_given), optarg, cmdline_parser_method_values, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "method", 'm',
              additional_error))
            goto failure;
        
          break;
        case 'n':	/* number of points for fitting
        stress-strain relationship.  */
        
        
          if (update_arg( (void *)&(args_info->npoints_arg), 
               &(args_info->npoints_orig), &(args_info->npoints_given),
              &(local_args_info.npoints_given), optarg, 0, "25", ARG_INT,
              check_ambiguity, override, 0, 0,
              "npoints", 'n',
              additional_error))
            goto failure;
        
          break;
        case 'd':	/* size of relative volume changes for strains.  */
        
        
          if (update_arg( (void *)&(args_info->delta_arg), 
               &(args_info->delta_orig), &(args_info->delta_given),
              &(local_args_info.delta_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "delta", 'd',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */




  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}